

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void highbd_filter_mask_dual(__m128i *p,__m128i *q,__m128i *l,__m128i *bl,__m128i *mask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  undefined1 auVar4 [16];
  ushort uVar11;
  undefined1 auVar12 [16];
  int local_46c;
  undefined1 local_468 [16];
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_3c8;
  ulong uStack_3c0;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  ushort local_358;
  ushort uStack_356;
  ushort uStack_354;
  ushort uStack_352;
  ushort uStack_350;
  ushort uStack_34e;
  ushort uStack_34c;
  ushort uStack_34a;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  int i;
  __m128i max;
  __m128i ffff;
  __m128i one;
  __m128i zero;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i *mask_local;
  
  auVar12 = psubusw((undefined1  [16])*p,(undefined1  [16])*q);
  auVar4 = psubusw((undefined1  [16])*q,(undefined1  [16])*p);
  local_258 = auVar12._0_8_;
  uStack_250 = auVar12._8_8_;
  local_268 = auVar4._0_8_;
  uStack_260 = auVar4._8_8_;
  auVar12 = psubusw((undefined1  [16])p[1],(undefined1  [16])q[1]);
  auVar4 = psubusw((undefined1  [16])q[1],(undefined1  [16])p[1]);
  local_298 = auVar12._0_8_;
  uStack_290 = auVar12._8_8_;
  local_2a8 = auVar4._0_8_;
  uStack_2a0 = auVar4._8_8_;
  local_298 = local_298 | local_2a8;
  uStack_290 = uStack_290 | uStack_2a0;
  auVar2._8_8_ = uStack_250 | uStack_260;
  auVar2._0_8_ = local_258 | local_268;
  auVar1._8_8_ = uStack_250 | uStack_260;
  auVar1._0_8_ = local_258 | local_268;
  auVar4 = paddusw(auVar2,auVar1);
  local_358 = (ushort)local_298;
  uStack_356 = (ushort)(local_298 >> 0x10);
  uStack_354 = (ushort)(local_298 >> 0x20);
  uStack_350 = (ushort)uStack_290;
  uStack_34e = (ushort)(uStack_290 >> 0x10);
  uStack_34c = (ushort)(uStack_290 >> 0x20);
  local_428 = CONCAT26((ushort)(local_298 >> 0x31),
                       CONCAT24(uStack_354 >> 1,CONCAT22(uStack_356 >> 1,local_358 >> 1)));
  uStack_420 = CONCAT26((ushort)(uStack_290 >> 0x31),
                        CONCAT24(uStack_34c >> 1,CONCAT22(uStack_34e >> 1,uStack_350 >> 1)));
  auVar12._8_8_ = uStack_420;
  auVar12._0_8_ = local_428;
  auVar4 = paddusw(auVar4,auVar12);
  auVar4 = psubusw(auVar4,(undefined1  [16])*bl);
  local_378 = auVar4._0_2_;
  sStack_376 = auVar4._2_2_;
  sStack_374 = auVar4._4_2_;
  sStack_372 = auVar4._6_2_;
  sStack_370 = auVar4._8_2_;
  sStack_36e = auVar4._10_2_;
  sStack_36c = auVar4._12_2_;
  sStack_36a = auVar4._14_2_;
  auVar4._8_8_ = 0x1000100010001;
  auVar4._0_8_ = 0x1000100010001;
  auVar4 = paddusw((undefined1  [16])*l,auVar4);
  local_3c8 = auVar4._0_8_;
  uStack_3c0 = auVar4._8_8_;
  local_468._8_8_ =
       (CONCAT26(-(ushort)(sStack_36a == 0),
                 CONCAT24(-(ushort)(sStack_36c == 0),
                          CONCAT22(-(ushort)(sStack_36e == 0),-(ushort)(sStack_370 == 0)))) ^
       0xffffffffffffffff) & uStack_3c0;
  local_468._0_8_ =
       (CONCAT26(-(ushort)(sStack_372 == 0),
                 CONCAT24(-(ushort)(sStack_374 == 0),
                          CONCAT22(-(ushort)(sStack_376 == 0),-(ushort)(local_378 == 0)))) ^
       0xffffffffffffffff) & local_3c8;
  for (local_46c = 1; local_46c < 4; local_46c = local_46c + 1) {
    auVar12 = psubusw((undefined1  [16])p[local_46c],(undefined1  [16])p[local_46c + -1]);
    auVar4 = psubusw((undefined1  [16])p[local_46c + -1],(undefined1  [16])p[local_46c]);
    local_2d8 = auVar12._0_8_;
    uStack_2d0 = auVar12._8_8_;
    local_2e8 = auVar4._0_8_;
    uStack_2e0 = auVar4._8_8_;
    local_2d8 = local_2d8 | local_2e8;
    uStack_2d0 = uStack_2d0 | uStack_2e0;
    ffff[1]._0_2_ = local_468._0_2_;
    ffff[1]._2_2_ = local_468._2_2_;
    ffff[1]._4_2_ = local_468._4_2_;
    ffff[1]._6_2_ = local_468._6_2_;
    one[0]._0_2_ = local_468._8_2_;
    one[0]._2_2_ = local_468._10_2_;
    one[0]._4_2_ = local_468._12_2_;
    one[0]._6_2_ = local_468._14_2_;
    max[1]._0_2_ = (short)local_2d8;
    max[1]._2_2_ = (short)(local_2d8 >> 0x10);
    max[1]._4_2_ = (short)(local_2d8 >> 0x20);
    max[1]._6_2_ = (short)(local_2d8 >> 0x30);
    ffff[0]._0_2_ = (short)uStack_2d0;
    ffff[0]._2_2_ = (short)(uStack_2d0 >> 0x10);
    ffff[0]._4_2_ = (short)(uStack_2d0 >> 0x20);
    ffff[0]._6_2_ = (short)(uStack_2d0 >> 0x30);
    uVar3 = (ushort)((short)ffff[1] < (short)max[1]) * (short)max[1] |
            (ushort)((short)ffff[1] >= (short)max[1]) * (short)ffff[1];
    uVar5 = (ushort)(ffff[1]._2_2_ < max[1]._2_2_) * max[1]._2_2_ |
            (ushort)(ffff[1]._2_2_ >= max[1]._2_2_) * ffff[1]._2_2_;
    uVar6 = (ushort)(ffff[1]._4_2_ < max[1]._4_2_) * max[1]._4_2_ |
            (ushort)(ffff[1]._4_2_ >= max[1]._4_2_) * ffff[1]._4_2_;
    uVar7 = (ushort)(ffff[1]._6_2_ < max[1]._6_2_) * max[1]._6_2_ |
            (ushort)(ffff[1]._6_2_ >= max[1]._6_2_) * ffff[1]._6_2_;
    uVar8 = (ushort)((short)one[0] < (short)ffff[0]) * (short)ffff[0] |
            (ushort)((short)one[0] >= (short)ffff[0]) * (short)one[0];
    uVar9 = (ushort)(one[0]._2_2_ < ffff[0]._2_2_) * ffff[0]._2_2_ |
            (ushort)(one[0]._2_2_ >= ffff[0]._2_2_) * one[0]._2_2_;
    uVar10 = (ushort)(one[0]._4_2_ < ffff[0]._4_2_) * ffff[0]._4_2_ |
             (ushort)(one[0]._4_2_ >= ffff[0]._4_2_) * one[0]._4_2_;
    uVar11 = (ushort)(one[0]._6_2_ < ffff[0]._6_2_) * ffff[0]._6_2_ |
             (ushort)(one[0]._6_2_ >= ffff[0]._6_2_) * one[0]._6_2_;
    auVar12 = psubusw((undefined1  [16])q[local_46c],(undefined1  [16])q[local_46c + -1]);
    auVar4 = psubusw((undefined1  [16])q[local_46c + -1],(undefined1  [16])q[local_46c]);
    local_318 = auVar12._0_8_;
    uStack_310 = auVar12._8_8_;
    local_328 = auVar4._0_8_;
    uStack_320 = auVar4._8_8_;
    local_318 = local_318 | local_328;
    uStack_310 = uStack_310 | uStack_320;
    local_88 = (short)local_318;
    sStack_86 = (short)(local_318 >> 0x10);
    sStack_84 = (short)(local_318 >> 0x20);
    sStack_82 = (short)(local_318 >> 0x30);
    sStack_80 = (short)uStack_310;
    sStack_7e = (short)(uStack_310 >> 0x10);
    sStack_7c = (short)(uStack_310 >> 0x20);
    sStack_7a = (short)(uStack_310 >> 0x30);
    local_468._2_2_ =
         (ushort)((short)uVar5 < sStack_86) * sStack_86 | ((short)uVar5 >= sStack_86) * uVar5;
    local_468._0_2_ =
         (ushort)((short)uVar3 < local_88) * local_88 | ((short)uVar3 >= local_88) * uVar3;
    local_468._4_2_ =
         (ushort)((short)uVar6 < sStack_84) * sStack_84 | ((short)uVar6 >= sStack_84) * uVar6;
    local_468._6_2_ =
         (ushort)((short)uVar7 < sStack_82) * sStack_82 | ((short)uVar7 >= sStack_82) * uVar7;
    local_468._8_2_ =
         (ushort)((short)uVar8 < sStack_80) * sStack_80 | ((short)uVar8 >= sStack_80) * uVar8;
    local_468._10_2_ =
         (ushort)((short)uVar9 < sStack_7e) * sStack_7e | ((short)uVar9 >= sStack_7e) * uVar9;
    local_468._12_2_ =
         (ushort)((short)uVar10 < sStack_7c) * sStack_7c | ((short)uVar10 >= sStack_7c) * uVar10;
    local_468._14_2_ =
         (ushort)((short)uVar11 < sStack_7a) * sStack_7a | ((short)uVar11 >= sStack_7a) * uVar11;
  }
  auVar4 = psubusw(local_468,(undefined1  [16])*l);
  local_398 = auVar4._0_2_;
  sStack_396 = auVar4._2_2_;
  sStack_394 = auVar4._4_2_;
  sStack_392 = auVar4._6_2_;
  sStack_390 = auVar4._8_2_;
  sStack_38e = auVar4._10_2_;
  sStack_38c = auVar4._12_2_;
  sStack_38a = auVar4._14_2_;
  *(ushort *)*mask = -(ushort)(local_398 == 0);
  *(ushort *)((long)*mask + 2) = -(ushort)(sStack_396 == 0);
  *(ushort *)((long)*mask + 4) = -(ushort)(sStack_394 == 0);
  *(ushort *)((long)*mask + 6) = -(ushort)(sStack_392 == 0);
  *(ushort *)(*mask + 1) = -(ushort)(sStack_390 == 0);
  *(ushort *)((long)*mask + 10) = -(ushort)(sStack_38e == 0);
  *(ushort *)((long)*mask + 0xc) = -(ushort)(sStack_38c == 0);
  *(ushort *)((long)*mask + 0xe) = -(ushort)(sStack_38a == 0);
  return;
}

Assistant:

static inline void highbd_filter_mask_dual(const __m128i *p, const __m128i *q,
                                           const __m128i *l, const __m128i *bl,
                                           __m128i *mask) {
  __m128i abs_p0q0 = abs_diff16(p[0], q[0]);
  __m128i abs_p1q1 = abs_diff16(p[1], q[1]);
  abs_p0q0 = _mm_adds_epu16(abs_p0q0, abs_p0q0);
  abs_p1q1 = _mm_srli_epi16(abs_p1q1, 1);

  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i ffff = _mm_set1_epi16((short)0xFFFF);

  __m128i max = _mm_subs_epu16(_mm_adds_epu16(abs_p0q0, abs_p1q1), *bl);
  max = _mm_xor_si128(_mm_cmpeq_epi16(max, zero), ffff);
  max = _mm_and_si128(max, _mm_adds_epu16(*l, one));

  int i;
  for (i = 1; i < 4; ++i) {
    max = _mm_max_epi16(max, abs_diff16(p[i], p[i - 1]));
    max = _mm_max_epi16(max, abs_diff16(q[i], q[i - 1]));
  }
  max = _mm_subs_epu16(max, *l);
  *mask = _mm_cmpeq_epi16(max, zero);  // return ~mask
}